

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O3

void ximu::PacketConstruction::
     constructReadRegisterPacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (RegisterData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  RegisterAddresses RVar1;
  uchar uVar2;
  pointer puVar3;
  initializer_list<unsigned_char> __l;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 2;
  RVar1 = RegisterData::address(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (undefined1)(RVar1 >> 8);
  RVar1 = RegisterData::address(data);
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (undefined1)RVar1;
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)
                 ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,__l,
             (allocator_type *)
             ((long)&decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + ~(ulong)local_40 == (pointer)0x0) {
    uVar2 = '\0';
  }
  else {
    puVar3 = (pointer)0x0;
    uVar2 = '\0';
    do {
      uVar2 = uVar2 + *(uchar *)((long)local_40 + (long)puVar3);
      puVar3 = puVar3 + 1;
    } while (decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + ~(ulong)local_40 != puVar3);
  }
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[-1] = uVar2;
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_40,
             (long)decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start - (long)local_40,dest);
  if (local_40 != (undefined1  [8])0x0) {
    operator_delete((void *)local_40);
  }
  return;
}

Assistant:

static void constructReadRegisterPacket(const RegisterData &data,
                                        OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::READ_REGISTER),
    static_cast<unsigned char>(static_cast<unsigned short>(
        data.address()) >> 8),
    static_cast<unsigned char>(data.address()),
    0 };

  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}